

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double folded_normal_cdf_inv(double cdf,double a,double b)

{
  double dVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  double local_68;
  double local_58;
  double local_38;
  double local_20;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    local_38 = 0.0;
    if ((cdf != 0.0) || (NAN(cdf))) {
      if ((cdf != 1.0) || (NAN(cdf))) {
        if (0.0 <= a) {
          dVar7 = normal_cdf_inv(cdf,a,b);
          uVar5 = SUB84(dVar7,0);
          uVar6 = (undefined4)((ulong)dVar7 >> 0x20);
        }
        else {
          dVar7 = normal_cdf_inv(cdf,-a,b);
          uVar5 = SUB84(dVar7,0);
          uVar6 = (undefined4)((ulong)dVar7 >> 0x20);
        }
        local_38 = -a;
        local_58 = r8_max((double)CONCAT44(uVar6,uVar5),0.0);
        local_20 = folded_normal_cdf(local_58,a,b);
        dVar7 = (1.0 - cdf) * 0.5;
        dVar1 = normal_cdf_inv(dVar7,a,b);
        dVar7 = normal_cdf_inv(dVar7,local_38,b);
        local_68 = r8_max(ABS(dVar1),ABS(dVar7));
        folded_normal_cdf(local_68,a,b);
        local_38 = (local_58 + local_68) * 0.5;
        dVar7 = folded_normal_cdf(local_38,a,b);
        uVar5 = SUB84(dVar7,0);
        uVar6 = (undefined4)((ulong)dVar7 >> 0x20);
        if (0.0001 <= ABS(dVar7 - cdf)) {
          iVar3 = 0x65;
          do {
            iVar3 = iVar3 + -1;
            if (iVar3 == 0) {
              std::operator<<((ostream *)&std::cerr," \n");
              std::operator<<((ostream *)&std::cerr,"FOLDED_NORMAL_CDF_INV - Fatal error!\n");
              poVar2 = std::operator<<((ostream *)&std::cerr,"  Iteration limit IT_MAX = ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
              pcVar4 = " exceeded.\n";
              goto LAB_0019d5db;
            }
            if ((((double)CONCAT44(uVar6,uVar5) <= cdf) && (local_20 <= cdf)) ||
               ((dVar7 = local_38, cdf <= (double)CONCAT44(uVar6,uVar5) && (cdf <= local_20)))) {
              local_20 = (double)CONCAT44(uVar6,uVar5);
              local_58 = local_38;
              dVar7 = local_68;
            }
            local_38 = (local_58 + dVar7) * 0.5;
            dVar1 = folded_normal_cdf(local_38,a,b);
            uVar5 = SUB84(dVar1,0);
            uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
            local_68 = dVar7;
          } while (0.0001 <= ABS(dVar1 - cdf));
        }
      }
      else {
        local_38 = 1e+30;
      }
    }
    return local_38;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"FOLDED_NORMAL_CDF_INV - Fatal error!\n");
  pcVar4 = "  CDF < 0 or 1 < CDF.\n";
  poVar2 = (ostream *)&std::cerr;
LAB_0019d5db:
  std::operator<<(poVar2,pcVar4);
  exit(1);
}

Assistant:

double folded_normal_cdf_inv ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    FOLDED_NORMAL_CDF_INV inverts the Folded Normal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= A,
//    0.0 < B.
//
//    Output, double FOLDED_NORMAL_CDF_INV, the argument of the CDF.
//    0.0 <= X.
//
{
  double cdf1;
  double cdf2;
  double cdf3;
  int it;
  int it_max = 100;
  const double r8_huge = 1.0E+30;
  double tol = 0.0001;
  double x;
  double x1;
  double x2;
  double x3;
  double xa;
  double xb;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "FOLDED_NORMAL_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = 0.0;
    return x;
  }
  else if ( 1.0 == cdf )
  {
    x = r8_huge;
    return x;
  }
//
//  Find X1, for which the value of CDF will be too small.
//
  if ( 0.0 <= a )
  {
    x1 = normal_cdf_inv ( cdf, a, b );
  }
  else
  {
    x1 = normal_cdf_inv ( cdf, -a, b );
  }
  x1 = r8_max ( x1, 0.0 );
  cdf1 = folded_normal_cdf ( x1, a, b );
//
//  Find X2, for which the value of CDF will be too big.
//
  cdf2 = ( 1.0 - cdf ) / 2.0;

  xa = normal_cdf_inv ( cdf2, a, b );
  xb = normal_cdf_inv ( cdf2, -a, b );
  x2 = r8_max ( fabs ( xa ), fabs ( xb ) );
  cdf2 = folded_normal_cdf ( x2, a, b );
//
//  Now use bisection.
//
  it = 0;

  for ( ; ; )
  {
    it = it + 1;

    x3 = 0.5 * ( x1 + x2 );
    cdf3 = folded_normal_cdf ( x3, a, b );

    if ( fabs ( cdf3 - cdf ) < tol )
    {
      x = x3;
      break;
    }

    if ( it_max < it )
    {
      cerr << " \n";
      cerr << "FOLDED_NORMAL_CDF_INV - Fatal error!\n";
      cerr << "  Iteration limit IT_MAX = " << it_max << " exceeded.\n";
      exit ( 1 );
    }

    if ( ( cdf3 <= cdf && cdf1 <= cdf ) || ( cdf <= cdf3 && cdf <= cdf1 ) )
    {
      x1 = x3;
      cdf1 = cdf3;
    }
    else
    {
      x2 = x3;
      cdf2 = cdf3;
    }
  }

  return x;
}